

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
* __thiscall
args::Group::GetChildDescriptions
          (Group *this,string *shortPrefix,string *longPrefix,string *shortSeparator,
          string *longSeparator,uint indent)

{
  __normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  __i;
  __normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  __i_00;
  bool bVar1;
  const_iterator __position;
  ulong uVar2;
  move_iterator<__gnu_cxx::__normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>_>
  __first;
  move_iterator<__gnu_cxx::__normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>_>
  __last;
  move_iterator<__gnu_cxx::__normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>_>
  this_00;
  string *in_RCX;
  Group *in_RDX;
  long in_RSI;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *in_RDI;
  string *in_R8;
  string *in_R9;
  uint unaff_retaddr;
  int in_stack_00000008;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  description;
  NamedBase *named;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  groupDescriptions;
  uchar addindent;
  Group *group;
  Base **child;
  const_iterator __end2;
  const_iterator __begin2;
  vector<args::Base_*,_std::allocator<args::Base_*>_> *__range2;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *descriptions;
  int in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  __normal_iterator<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  *in_stack_fffffffffffffe70;
  uint *in_stack_fffffffffffffe78;
  __tuple_element_t<0UL,_tuple<basic_string<char>,_basic_string<char>_>_> *in_stack_fffffffffffffe80
  ;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  Base *in_stack_fffffffffffffe90;
  uint local_110 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_c8;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_c0;
  __normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  local_b8;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_b0;
  __normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  local_a8;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_a0;
  byte local_61;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_60;
  reference local_58;
  Base **local_50;
  __normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
  local_48;
  long local_40;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 uVar3;
  
  uVar3 = 0;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)0x14d8d8);
  local_40 = in_RSI + 0x30;
  local_48._M_current =
       (Base **)std::vector<args::Base_*,_std::allocator<args::Base_*>_>::begin
                          ((vector<args::Base_*,_std::allocator<args::Base_*>_> *)
                           CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  local_50 = (Base **)std::vector<args::Base_*,_std::allocator<args::Base_*>_>::end
                                ((vector<args::Base_*,_std::allocator<args::Base_*>_> *)
                                 CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
                             *)in_stack_fffffffffffffe70,
                            (__normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
                             *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)), bVar1
        ) {
    local_58 = __gnu_cxx::
               __normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
               ::operator*(&local_48);
    if (*local_58 == (Base *)0x0) {
      __position._M_current =
           (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
            *)0x0;
    }
    else {
      __position._M_current =
           (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
            *)__dynamic_cast(*local_58,&Base::typeinfo,&typeinfo,0);
    }
    local_60 = __position._M_current;
    if (__position._M_current ==
        (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
         *)0x0) {
      in_stack_fffffffffffffe90 = *local_58;
      if (in_stack_fffffffffffffe90 == (Base *)0x0) {
        in_stack_fffffffffffffe88 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      else {
        in_stack_fffffffffffffe88 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __dynamic_cast(in_stack_fffffffffffffe90,&Base::typeinfo,&NamedBase::typeinfo,0);
      }
      local_d0 = in_stack_fffffffffffffe88;
      if (in_stack_fffffffffffffe88 !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)in_stack_fffffffffffffe88 + 0x18))
                  (local_110,in_stack_fffffffffffffe88,in_RDX,in_RCX,in_R8,in_R9);
        in_stack_fffffffffffffe78 = local_110;
        in_stack_fffffffffffffe80 =
             std::get<0ul,std::__cxx11::string,std::__cxx11::string>
                       ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)0x14dc2b);
        std::get<1ul,std::__cxx11::string,std::__cxx11::string>
                  ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)0x14dc3a);
        std::
        vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>
        ::emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_int_const&>
                  ((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                   in_stack_fffffffffffffe78);
        std::
        tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~tuple((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x14dc63);
      }
    }
    else {
      local_61 = 0;
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        std::
        vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>
        ::emplace_back<std::__cxx11::string_const&,char_const(&)[1],unsigned_int_const&>
                  ((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                   (char (*) [1])in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
        local_61 = 1;
      }
      in_stack_fffffffffffffe68 = in_stack_00000008 + (uint)local_61;
      GetChildDescriptions
                (in_RDX,in_RCX,in_R8,in_R9,(string *)CONCAT17(uVar3,in_stack_ffffffffffffffc8),
                 unaff_retaddr);
      __first._M_current._M_current =
           std::
           end<std::vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>>
                     ((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      local_a0 = (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                  *)__first._M_current._M_current;
      __gnu_cxx::
      __normal_iterator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>const*,std::vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>>
      ::__normal_iterator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>*>
                (in_stack_fffffffffffffe70,
                 (__normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      __last._M_current._M_current =
           std::
           begin<std::vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>>
                     ((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      __i._M_current._4_4_ = in_stack_fffffffffffffe6c;
      __i._M_current._0_4_ = in_stack_fffffffffffffe68;
      local_b0 = (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                  *)__last._M_current._M_current;
      this_00 = std::
                make_move_iterator<__gnu_cxx::__normal_iterator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>*,std::vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>>>
                          (__i);
      local_a8._M_current =
           (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
            *)this_00;
      local_c0 = (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                  *)std::
                    end<std::vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>>
                              ((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      __i_00._M_current._4_4_ = in_stack_fffffffffffffe6c;
      __i_00._M_current._0_4_ = in_stack_fffffffffffffe68;
      local_b8._M_current =
           (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
            *)std::
              make_move_iterator<__gnu_cxx::__normal_iterator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>*,std::vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>>>
                        (__i_00);
      local_c8 = (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                  *)std::
                    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>
                    ::
                    insert<std::move_iterator<__gnu_cxx::__normal_iterator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>*,std::vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>>>,void>
                              ((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                *)this_00._M_current._M_current,__position,__first,__last);
      std::
      vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ::~vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 *)in_stack_fffffffffffffe80);
    }
    __gnu_cxx::
    __normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
    ::operator++(&local_48);
  }
  return in_RDI;
}

Assistant:

std::vector<std::tuple<std::string, std::string, unsigned int>> GetChildDescriptions(const std::string &shortPrefix, const std::string &longPrefix, const std::string &shortSeparator, const std::string &longSeparator, const unsigned int indent = 0) const
            {
                std::vector<std::tuple<std::string, std::string, unsigned int>> descriptions;
                for (const auto &child: children)
                {
                    if (const auto group = dynamic_cast<Group *>(child))
                    {
                        // Push that group description on the back if not empty
                        unsigned char addindent = 0;
                        if (!group->help.empty())
                        {
                            descriptions.emplace_back(group->help, "", indent);
                            addindent = 1;
                        }
                        auto groupDescriptions = group->GetChildDescriptions(shortPrefix, longPrefix, shortSeparator, longSeparator, indent + addindent);
                        descriptions.insert(
                            std::end(descriptions),
                            std::make_move_iterator(std::begin(groupDescriptions)),
                            std::make_move_iterator(std::end(groupDescriptions)));
                    } else if (const auto named = dynamic_cast<NamedBase *>(child))
                    {
                        const auto description = named->GetDescription(shortPrefix, longPrefix, shortSeparator, longSeparator);
                        descriptions.emplace_back(std::get<0>(description), std::get<1>(description), indent);
                    }
                }
                return descriptions;
            }